

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O2

void mergesort_4way(uchar **strings,size_t n,uchar **tmp)

{
  ulong n_00;
  ulong uVar1;
  size_t n_01;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,(size_t)tmp);
    return;
  }
  n_00 = n >> 2;
  uVar1 = n >> 1;
  mergesort_4way(strings,n_00,tmp);
  mergesort_4way(strings + n_00,uVar1 - n_00,tmp);
  mergesort_4way(strings + uVar1,n_00,tmp);
  n_01 = n - (n_00 + uVar1);
  mergesort_4way(strings + n_00 + uVar1,n_01,tmp);
  merge_4way(strings,n_00,strings + n_00,uVar1 - n_00,strings + uVar1,n_00,strings + n_00 + uVar1,
             n_01,tmp);
  memcpy(strings,tmp,n << 3);
  return;
}

Assistant:

void
mergesort_4way(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = split0+split1;
	mergesort_4way(strings,        split0,        tmp);
	mergesort_4way(strings+split0, split1-split0, tmp);
	mergesort_4way(strings+split1, split2-split1, tmp);
	mergesort_4way(strings+split2, n-split2,      tmp);
	merge_4way(strings,        split0,
	           strings+split0, split1-split0,
	           strings+split1, split2-split1,
	           strings+split2, n-split2,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}